

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

char * luaT_objtypename(lua_State *L,TValue *o)

{
  Table *t;
  TString *key;
  TValue *pTVar1;
  
  if (o->tt_ == 0x47) {
    t = *(Table **)((o->value_).f + 0x10);
  }
  else {
    if (o->tt_ != 0x45) goto LAB_0011a4a5;
    t = *(Table **)((o->value_).f + 0x28);
  }
  if (t != (Table *)0x0) {
    key = luaS_new(L,"__name");
    pTVar1 = luaH_getshortstr(t,key);
    if ((pTVar1->tt_ & 0xfU) == 4) {
      return (char *)((pTVar1->value_).f + 0x18);
    }
  }
LAB_0011a4a5:
  return luaT_typenames_[(ulong)(o->tt_ & 0xf) + 1];
}

Assistant:

const char *luaT_objtypename(lua_State *L, const TValue *o) {
    Table *mt;
    if ((ttistable(o) && (mt = hvalue(o)->metatable) != NULL) ||
        (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL)) {
        const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
        if (ttisstring(name))  /* is '__name' a string? */
            return getstr(tsvalue(name));  /* use it as type name */
    }
    return ttypename(ttnov(o));  /* else use standard type name */
}